

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_acquire_write(ma_pcm_rb *pRB,ma_uint32 *pSizeInFrames,void **ppBufferOut)

{
  ulong uVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  ulong uStack_50;
  ma_result result;
  size_t sizeInBytes;
  void **ppBufferOut_local;
  ma_uint32 *pSizeInFrames_local;
  ma_pcm_rb *pRB_local;
  ma_uint32 *local_28;
  ma_uint32 local_20;
  ma_format local_1c;
  ma_pcm_rb *local_18;
  ma_uint32 local_10;
  ma_format local_c;
  
  if (pRB == (ma_pcm_rb *)0x0) {
    pRB_local._4_4_ = -2;
  }
  else {
    mVar3 = *pSizeInFrames;
    sizeInBytes = (size_t)ppBufferOut;
    ppBufferOut_local = (void **)pSizeInFrames;
    pSizeInFrames_local = (ma_uint32 *)pRB;
    local_18 = pRB;
    if (pRB == (ma_pcm_rb *)0x0) {
      __assert_fail("pRB != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x9794,"ma_uint32 ma_pcm_rb_get_bpf(ma_pcm_rb *)");
    }
    local_c = pRB->format;
    local_10 = pRB->channels;
    mVar2 = ma_get_bytes_per_sample(local_c);
    uStack_50 = (ulong)(mVar3 * mVar2 * local_10);
    pRB_local._4_4_ =
         ma_rb_acquire_write((ma_rb *)pSizeInFrames_local,&stack0xffffffffffffffb0,
                             (void **)sizeInBytes);
    uVar1 = uStack_50;
    if (pRB_local._4_4_ == 0) {
      local_28 = pSizeInFrames_local;
      if (pSizeInFrames_local == (ma_uint32 *)0x0) {
        __assert_fail("pRB != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x9794,"ma_uint32 ma_pcm_rb_get_bpf(ma_pcm_rb *)");
      }
      local_1c = pSizeInFrames_local[0x10];
      local_20 = pSizeInFrames_local[0x11];
      mVar3 = ma_get_bytes_per_sample(local_1c);
      *(int *)ppBufferOut_local = (int)(uVar1 / (mVar3 * local_20));
      pRB_local._4_4_ = 0;
    }
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_pcm_rb_acquire_write(ma_pcm_rb* pRB, ma_uint32* pSizeInFrames, void** ppBufferOut)
{
    size_t sizeInBytes;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    sizeInBytes = *pSizeInFrames * ma_pcm_rb_get_bpf(pRB);

    result = ma_rb_acquire_write(&pRB->rb, &sizeInBytes, ppBufferOut);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pSizeInFrames = (ma_uint32)(sizeInBytes / ma_pcm_rb_get_bpf(pRB));
    return MA_SUCCESS;
}